

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_frigidaura(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  undefined2 in_DI;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  ulong local_60 [2];
  undefined4 local_50;
  undefined2 local_8;
  undefined2 local_4;
  
  local_4 = in_DI;
  local_8 = in_SI;
  bVar1 = is_affected(in_RDX,(int)gsn_frigidaura);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6dd9cc);
    local_50 = 0;
    _Var2 = std::pow<int,int>(0,0x6dda2b);
    local_60[0] = (long)_Var2 | local_60[0];
    affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    uVar3 = 4;
    zero_vector((long *)local_60);
    _Var2 = std::pow<int,int>(0,0x6dda69);
    local_60[0] = (long)_Var2 | local_60[0];
    affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act((char *)CONCAT26(local_8,CONCAT24(local_4,CONCAT22(uVar3,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    act((char *)CONCAT26(local_8,CONCAT24(local_4,CONCAT22(uVar3,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  }
  return;
}

Assistant:

void spell_frigidaura(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_frigidaura))
	{
		send_to_char("You are already surrounded by an aura of cold.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_RESIST;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 3;
	af.mod_name = MOD_RESISTANCE;

	SET_BIT(af.bitvector, RES_COLD);

	affect_to_char(ch, &af);

	af.where = TO_VULN;
	zero_vector(af.bitvector);

	SET_BIT(af.bitvector, VULN_FIRE);

	affect_to_char(ch, &af);

	act("You chill the air around you, prepared to lash out at any who come near.", ch, 0, 0, TO_CHAR);
	act("$n is briefly surrounded by an aura of ice, which rapidly fades away.", ch, 0, 0, TO_ROOM);
}